

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseContainer.cpp
# Opt level: O2

void __thiscall
Saturation::ActiveClauseContainer::onLimitsUpdated
          (ActiveClauseContainer *this,PassiveClauseContainer *limits)

{
  Clause *pCVar1;
  bool bVar2;
  int iVar3;
  Iterator local_48;
  
  iVar3 = (*(limits->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer
            [0xd])(limits);
  if ((char)iVar3 != '\0') {
    if ((onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove == '\0') &&
       (iVar3 = __cxa_guard_acquire(&onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove)
       , iVar3 != 0)) {
      Lib::Stack<Kernel::Clause_*>::Stack(&onLimitsUpdated::toRemove,0x40);
      __cxa_atexit(Lib::Stack<Kernel::Clause_*>::~Stack,&onLimitsUpdated::toRemove,&__dso_handle);
      __cxa_guard_release(&onLimitsUpdated(Saturation::PassiveClauseContainer*)::toRemove);
    }
    onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._stack;
    local_48._next = (this->_clauses)._entries;
    local_48._last = (this->_clauses)._afterLast;
    while (bVar2 = Lib::Set<Kernel::Clause_*,_Lib::DefaultHash>::Iterator::hasNext(&local_48), bVar2
          ) {
      pCVar1 = (local_48._next)->value;
      local_48._next = local_48._next + 1;
      iVar3 = (*(limits->super_RandomAccessClauseContainer).super_ClauseContainer.
                _vptr_ClauseContainer[0xe])
                        (limits,pCVar1,(ulong)(*(uint *)&pCVar1->field_0x3c & 0xfffff));
      if ((char)iVar3 != '\0') {
        Lib::Stack<Kernel::Clause_*>::push(&onLimitsUpdated::toRemove,pCVar1);
      }
    }
    while (onLimitsUpdated::toRemove._cursor != onLimitsUpdated::toRemove._stack) {
      pCVar1 = onLimitsUpdated::toRemove._cursor[-1];
      onLimitsUpdated::toRemove._cursor = onLimitsUpdated::toRemove._cursor + -1;
      *(int *)(DAT_00a141a0 + 0x1e4) = *(int *)(DAT_00a141a0 + 0x1e4) + 1;
      (*(this->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[4])
                (this,pCVar1);
    }
  }
  return;
}

Assistant:

void ActiveClauseContainer::onLimitsUpdated(PassiveClauseContainer* limits)
{
  ASS(limits);
  if (!limits->mayBeAbleToDiscriminateChildrenOnLimits()) {
    return;
  }

  static Stack<Clause*> toRemove(64);
  toRemove.reset();

  auto rit = _clauses.iter();
  while (rit.hasNext()) {
    Clause* cl=rit.next();
    ASS(cl);

    if (limits->allChildrenNecessarilyExceedLimits(cl, cl->numSelected()))
    {
      ASS(cl->store()==Clause::ACTIVE);
      toRemove.push(cl);
    }
  }

#if OUTPUT_LRS_DETAILS
  if (toRemove.isNonEmpty()) {
    cout<<toRemove.size()<<" active deleted\n";
  }
#endif

  while (toRemove.isNonEmpty()) {
    Clause* removed=toRemove.pop();
    ASS(removed->store()==Clause::ACTIVE);

    RSTAT_CTR_INC("clauses discarded from active on limit update");
    env.statistics->discardedNonRedundantClauses++;

    remove(removed);
    // ASS_NEQ(removed->store(), Clause::ACTIVE); -- the remove could have deleted the clause - do not touch!
  }
}